

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_check_curve(mbedtls_ssl_context *ssl,mbedtls_ecp_group_id grp_id)

{
  mbedtls_ecp_group_id mVar1;
  mbedtls_ecp_group_id *pmVar2;
  
  pmVar2 = ssl->conf->curve_list;
  if (pmVar2 != (mbedtls_ecp_group_id *)0x0) {
    mVar1 = *pmVar2;
    while (mVar1 != MBEDTLS_ECP_DP_NONE) {
      pmVar2 = pmVar2 + 1;
      if (mVar1 == grp_id) {
        return 0;
      }
      mVar1 = *pmVar2;
    }
  }
  return -1;
}

Assistant:

int mbedtls_ssl_check_curve( const mbedtls_ssl_context *ssl, mbedtls_ecp_group_id grp_id )
{
    const mbedtls_ecp_group_id *gid;

    if( ssl->conf->curve_list == NULL )
        return( -1 );

    for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
        if( *gid == grp_id )
            return( 0 );

    return( -1 );
}